

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

SquareMatrix<2> __thiscall pbrt::SquareMatrix<2>::operator/(SquareMatrix<2> *this,Float s)

{
  SquareMatrix<2> SVar1;
  int j;
  int i;
  Float s_local;
  SquareMatrix<2> *this_local;
  SquareMatrix<2> r;
  
  r.m[0] = this->m[0];
  r.m[1] = this->m[1];
  for (i = 0; i < 2; i = i + 1) {
    for (j = 0; j < 2; j = j + 1) {
      r.m[i][j] = r.m[i][j] / s;
    }
  }
  SVar1.m[0][0] = r.m[0][0];
  SVar1.m[0][1] = r.m[0][1];
  SVar1.m[1][0] = r.m[1][0];
  SVar1.m[1][1] = r.m[1][1];
  return (SquareMatrix<2>)SVar1.m;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }